

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O1

void __thiscall common_log_entry::print(common_log_entry *this,FILE *file)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 *puVar4;
  char *pcVar5;
  char *pcVar6;
  char *__format;
  int iVar7;
  
  if (file == (FILE *)0x0) {
    if ((this->level == GGML_LOG_LEVEL_DEBUG) && (common_log_verbosity_thold < 1)) {
      return;
    }
    if (this->level == GGML_LOG_LEVEL_NONE) {
      puVar4 = (undefined8 *)&stdout;
    }
    else {
      puVar4 = (undefined8 *)&stderr;
    }
    file = (FILE *)*puVar4;
  }
  if (((this->level == GGML_LOG_LEVEL_NONE) || (this->level == GGML_LOG_LEVEL_CONT)) ||
     (this->prefix != true)) goto switchD_0020e983_default;
  lVar1 = this->timestamp;
  if (lVar1 != 0) {
    auVar3 = SEXT816(lVar1 / 1000000) * ZEXT816(0x8888888888888889);
    auVar2 = SEXT816(lVar1 / 1000) * SEXT816(0x20c49ba5e353f7cf);
    iVar7 = (int)(lVar1 / 1000);
    fprintf((FILE *)file,"%s%d.%02d.%03d.%03d%s ",
            g_col.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start[5],
            (ulong)(uint)((int)(SUB168(SEXT816(lVar1) * ZEXT816(0x8f2a633943a6d729),8) >> 0x19) -
                         (SUB164(SEXT816(lVar1) * ZEXT816(0x8f2a633943a6d729),0xc) >> 0x1f)),
            (ulong)(uint)((int)(lVar1 / 1000000) +
                         ((int)(auVar3._8_8_ >> 5) - (auVar3._12_4_ >> 0x1f)) * -0x3c),
            (ulong)(uint)(iVar7 + ((int)(auVar2._8_8_ >> 7) - (auVar2._12_4_ >> 0x1f)) * -1000),
            (ulong)(uint)((int)lVar1 + iVar7 * -1000),
            *g_col.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start);
  }
  switch(this->level) {
  case GGML_LOG_LEVEL_DEBUG:
    pcVar6 = g_col.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start[4];
    __format = "%sD %s";
    break;
  case GGML_LOG_LEVEL_INFO:
    pcVar5 = *g_col.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pcVar6 = g_col.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start[3];
    __format = "%sI %s";
    goto LAB_0020e9dd;
  case GGML_LOG_LEVEL_WARN:
    pcVar6 = g_col.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start[6];
    __format = "%sW %s";
    break;
  case GGML_LOG_LEVEL_ERROR:
    pcVar6 = g_col.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start[2];
    __format = "%sE %s";
    break;
  default:
    goto switchD_0020e983_default;
  }
  pcVar5 = "";
LAB_0020e9dd:
  fprintf((FILE *)file,__format,pcVar6,pcVar5);
switchD_0020e983_default:
  fputs((this->msg).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start,(FILE *)file);
  if ((this->level < GGML_LOG_LEVEL_CONT) && ((0x1aU >> (this->level & 0x1f) & 1) != 0)) {
    fputs(*g_col.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_start,(FILE *)file);
  }
  fflush((FILE *)file);
  return;
}

Assistant:

void print(FILE * file = nullptr) const {
        FILE * fcur = file;
        if (!fcur) {
            // stderr displays DBG messages only when their verbosity level is not higher than the threshold
            // these messages will still be logged to a file
            if (level == GGML_LOG_LEVEL_DEBUG && common_log_verbosity_thold < LOG_DEFAULT_DEBUG) {
                return;
            }

            fcur = stdout;

            if (level != GGML_LOG_LEVEL_NONE) {
                fcur = stderr;
            }
        }

        if (level != GGML_LOG_LEVEL_NONE && level != GGML_LOG_LEVEL_CONT && prefix) {
            if (timestamp) {
                // [M.s.ms.us]
                fprintf(fcur, "%s%d.%02d.%03d.%03d%s ",
                        g_col[COMMON_LOG_COL_BLUE],
                        (int) (timestamp / 1000000 / 60),
                        (int) (timestamp / 1000000 % 60),
                        (int) (timestamp / 1000 % 1000),
                        (int) (timestamp % 1000),
                        g_col[COMMON_LOG_COL_DEFAULT]);
            }

            switch (level) {
                case GGML_LOG_LEVEL_INFO:  fprintf(fcur, "%sI %s", g_col[COMMON_LOG_COL_GREEN],   g_col[COMMON_LOG_COL_DEFAULT]); break;
                case GGML_LOG_LEVEL_WARN:  fprintf(fcur, "%sW %s", g_col[COMMON_LOG_COL_MAGENTA], ""                        ); break;
                case GGML_LOG_LEVEL_ERROR: fprintf(fcur, "%sE %s", g_col[COMMON_LOG_COL_RED],     ""                        ); break;
                case GGML_LOG_LEVEL_DEBUG: fprintf(fcur, "%sD %s", g_col[COMMON_LOG_COL_YELLOW],  ""                        ); break;
                default:
                    break;
            }
        }

        fprintf(fcur, "%s", msg.data());

        if (level == GGML_LOG_LEVEL_WARN || level == GGML_LOG_LEVEL_ERROR || level == GGML_LOG_LEVEL_DEBUG) {
            fprintf(fcur, "%s", g_col[COMMON_LOG_COL_DEFAULT]);
        }

        fflush(fcur);
    }